

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithMapBufferFlushCase::init
          (ModifyAfterWithMapBufferFlushCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  long lVar2;
  char *pcVar3;
  EVP_PKEY_CTX *ctx_00;
  bool bVar4;
  undefined1 local_1a0 [384];
  
  local_1a0._0_8_ =
       ((this->
        super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
        ).
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
        .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Testing performance of MapBufferRange() command after a draw command that sources data from the target buffer.\n"
             ,0x6f);
  pcVar3 = "Whole buffer is mapped.\n";
  bVar4 = this->m_partialUpload != false;
  if (bVar4) {
    pcVar3 = "Half of the buffer is mapped.\n";
  }
  lVar2 = 0x18;
  if (bVar4) {
    lVar2 = 0x1e;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Map bits:\n",10);
  bVar4 = (this->m_mapFlags & 2) == 0;
  pcVar3 = "\tGL_MAP_WRITE_BIT\n";
  if (bVar4) {
    pcVar3 = "";
  }
  lVar2 = 0x12;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  bVar4 = (this->m_mapFlags & 1) == 0;
  pcVar3 = "\tGL_MAP_READ_BIT\n";
  if (bVar4) {
    pcVar3 = "";
  }
  lVar2 = 0x11;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  bVar4 = (this->m_mapFlags & 4) == 0;
  pcVar3 = "\tGL_MAP_INVALIDATE_RANGE_BIT\n";
  if (bVar4) {
    pcVar3 = "";
  }
  lVar2 = 0x1d;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  bVar4 = (this->m_mapFlags & 8) == 0;
  pcVar3 = "\tGL_MAP_INVALIDATE_BUFFER_BIT\n";
  if (bVar4) {
    pcVar3 = "";
  }
  lVar2 = 0x1e;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  lVar2 = 0;
  bVar4 = (this->m_mapFlags & 0x20) == 0;
  pcVar3 = "\tGL_MAP_UNSYNCHRONIZED_BIT\n";
  if (bVar4) {
    pcVar3 = "";
  }
  if (!bVar4) {
    lVar2 = 0x1b;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  pcVar3 = "\tGL_MAP_FLUSH_EXPLICIT_BIT\n";
  lVar2 = 0x1b;
  if ((this->m_mapFlags & 0x10) == 0) {
    pcVar3 = "";
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  iVar1 = ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
          ::init(&this->
                  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
                 ,ctx_00);
  return iVar1;
}

Assistant:

void ModifyAfterWithMapBufferFlushCase::init (void)
{
	// Log the purpose of the test

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing performance of MapBufferRange() command after a draw command that sources data from the target buffer.\n"
		<< ((m_partialUpload) ?
			("Half of the buffer is mapped.\n") :
			("Whole buffer is mapped.\n"))
		<< "Map bits:\n"
		<< ((m_mapFlags & GL_MAP_WRITE_BIT) ? ("\tGL_MAP_WRITE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_READ_BIT) ? ("\tGL_MAP_READ_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_RANGE_BIT) ? ("\tGL_MAP_INVALIDATE_RANGE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_BUFFER_BIT) ? ("\tGL_MAP_INVALIDATE_BUFFER_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_UNSYNCHRONIZED_BIT) ? ("\tGL_MAP_UNSYNCHRONIZED_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_FLUSH_EXPLICIT_BIT) ? ("\tGL_MAP_FLUSH_EXPLICIT_BIT\n") : (""))
		<< tcu::TestLog::EndMessage;

	ModifyAfterBasicCase<MapBufferRangeFlushDurationNoAlloc>::init();
}